

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read_benchmark.cpp
# Opt level: O3

vector<unsigned_char,_std::allocator<unsigned_char>_> *
anon_unknown.dwarf_bc86::read_iostream_range
          (vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,
          char *file_name)

{
  long lVar1;
  istreambuf_iterator<char,_std::char_traits<char>_> __first;
  ifstream file;
  undefined1 auStack_228 [7];
  allocator_type local_221;
  long local_220 [3];
  undefined4 auStack_204 [51];
  undefined8 auStack_138 [36];
  
  std::ifstream::ifstream(local_220);
  lVar1 = *(long *)(local_220[0] + -0x18);
  *(undefined4 *)((long)auStack_204 + lVar1) = 1;
  std::ios::clear((int)auStack_228 + (int)lVar1 + 8);
  std::ifstream::open((char *)local_220,(_Ios_Openmode)file_name);
  __first._8_8_ = 0xffffffff;
  __first._M_sbuf = *(streambuf_type **)((long)auStack_138 + *(long *)(local_220[0] + -0x18));
  std::vector<unsigned_char,std::allocator<unsigned_char>>::
  vector<std::istreambuf_iterator<char,std::char_traits<char>>,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)__return_storage_ptr__,__first,
             (istreambuf_iterator<char,_std::char_traits<char>_>)(ZEXT816(0xffffffff) << 0x40),
             &local_221);
  std::ifstream::~ifstream(local_220);
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::uint8_t> read_iostream_range(const char* file_name)
{
    std::ifstream file{};
    file.exceptions(std::ios::badbit);
    file.open(file_name, std::ios_base::binary);

    return std::vector<uint8_t>(std::istreambuf_iterator<char>(file),
                                std::istreambuf_iterator<char>());
}